

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_OffsetInfo ZSTD_getOffsetInfo(ZSTD_seqSymbol *offTable,int nbSeq)

{
  int iVar1;
  ZSTD_OffsetInfo ZVar2;
  ZSTD_OffsetInfo ZVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  
  if (nbSeq == 0) {
    ZVar3.longOffsetShare = 0;
    ZVar3.maxNbAdditionalBits = 0;
    return ZVar3;
  }
  if (offTable->baseValue < 9) {
    lVar5 = 0;
    iVar1 = 0;
    uVar6 = 0;
    do {
      bVar4 = offTable[lVar5 + 1].nbAdditionalBits;
      if (uVar6 <= bVar4) {
        uVar6 = (uint)bVar4;
      }
      iVar1 = (iVar1 + 1) - (uint)(bVar4 < 0x17);
      lVar5 = lVar5 + 1;
      bVar4 = (byte)offTable->baseValue;
    } while ((uint)lVar5 >> (bVar4 & 0x1f) == 0);
    ZVar2.longOffsetShare = iVar1 << (8 - bVar4 & 0x1f);
    ZVar2.maxNbAdditionalBits = uVar6;
    return ZVar2;
  }
  __assert_fail("max <= (1 << OffFSELog)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0xac5d,"ZSTD_OffsetInfo ZSTD_getOffsetInfo(const ZSTD_seqSymbol *, int)");
}

Assistant:

static ZSTD_OffsetInfo
ZSTD_getOffsetInfo(const ZSTD_seqSymbol* offTable, int nbSeq)
{
    ZSTD_OffsetInfo info = {0, 0};
    /* If nbSeq == 0, then the offTable is uninitialized, but we have
     * no sequences, so both values should be 0.
     */
    if (nbSeq != 0) {
        const void* ptr = offTable;
        U32 const tableLog = ((const ZSTD_seqSymbol_header*)ptr)[0].tableLog;
        const ZSTD_seqSymbol* table = offTable + 1;
        U32 const max = 1 << tableLog;
        U32 u;
        DEBUGLOG(5, "ZSTD_getLongOffsetsShare: (tableLog=%u)", tableLog);

        assert(max <= (1 << OffFSELog));  /* max not too large */
        for (u=0; u<max; u++) {
            info.maxNbAdditionalBits = MAX(info.maxNbAdditionalBits, table[u].nbAdditionalBits);
            if (table[u].nbAdditionalBits > 22) info.longOffsetShare += 1;
        }

        assert(tableLog <= OffFSELog);
        info.longOffsetShare <<= (OffFSELog - tableLog);  /* scale to OffFSELog */
    }

    return info;
}